

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::runner
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this)

{
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  string_view local_20;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *local_10;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  
  local_10 = this;
  memset(this,0,0x1e8);
  reporter<boost::ext::ut::v1_1_8::printer>::reporter(&this->reporter_);
  memset(&this->suites_,0,0x18);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::vector(&this->suites_);
  this->level_ = 0;
  this->run_ = false;
  this->fails_ = 0;
  local_38 = (this->path_)._M_elems;
  do {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (basic_string_view<char,_std::char_traits<char>_> *)&this->filter_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20);
  filter::filter(&this->filter_,local_20);
  memset(&this->tag_,0,0x18);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&this->tag_);
  this->dry_run_ = false;
  return;
}

Assistant:

constexpr runner() = default;